

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_13465d::CreateJumpNotZero
                    (VmModule *module,SynBase *source,VmValue *value,VmValue *trueLabel,
                    VmValue *falseLabel)

{
  VmInstruction *pVVar1;
  VmValue *in_stack_fffffffffffffff8;
  
  if (((value->type).type != VM_TYPE_INT) || ((value->type).size != 4)) {
    __assert_fail("value->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2d9,
                  "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (((trueLabel->type).type == VM_TYPE_BLOCK) && ((trueLabel->type).size == 4)) {
    if (((falseLabel->type).type == VM_TYPE_BLOCK) && ((falseLabel->type).size == 4)) {
      pVVar1 = CreateInstruction((anon_unknown_dwarf_13465d *)module,(VmModule *)source,
                                 (SynBase *)0x0,(VmType)(ZEXT816(0x1e) << 0x40),
                                 (VmInstructionType)value,trueLabel,falseLabel,(VmValue *)0x0,
                                 (VmValue *)0x0,in_stack_fffffffffffffff8);
      return &pVVar1->super_VmValue;
    }
    __assert_fail("falseLabel->type == VmType::Block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2db,
                  "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  __assert_fail("trueLabel->type == VmType::Block",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x2da,
                "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
               );
}

Assistant:

VmValue* CreateJumpNotZero(VmModule *module, SynBase *source, VmValue *value, VmValue *trueLabel, VmValue *falseLabel)
	{
		assert(value->type == VmType::Int);
		assert(trueLabel->type == VmType::Block);
		assert(falseLabel->type == VmType::Block);

		return CreateInstruction(module, source, VmType::Void, VM_INST_JUMP_NZ, value, trueLabel, falseLabel);
	}